

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDefs.cpp
# Opt level: O2

void glu::checkError(deUint32 err,char *msg,char *file,int line)

{
  ostream *poVar1;
  OutOfMemoryError *this;
  Enum<int,_2UL> local_1c0 [2];
  ostringstream msgStr;
  
  if (err == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msgStr);
  if (msg != (char *)0x0) {
    poVar1 = std::operator<<(&msgStr.super_basic_ostream<char,_std::char_traits<char>_>,msg);
    std::operator<<(poVar1,": ");
  }
  poVar1 = std::operator<<(&msgStr.super_basic_ostream<char,_std::char_traits<char>_>,
                           "glGetError() returned ");
  local_1c0[0].m_getName = getErrorName;
  local_1c0[0].m_value = err;
  tcu::Format::Enum<int,_2UL>::toStream(local_1c0,poVar1);
  this = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
  if (err == 0x505) {
    std::__cxx11::stringbuf::str();
    OutOfMemoryError::OutOfMemoryError(this,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
    __cxa_throw(this,&OutOfMemoryError::typeinfo,OutOfMemoryError::~OutOfMemoryError);
  }
  std::__cxx11::stringbuf::str();
  Error::Error((Error *)this,err,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
  __cxa_throw(this,&Error::typeinfo,Error::~Error);
}

Assistant:

void checkError (deUint32 err, const char* msg, const char* file, int line)
{
	if (err != GL_NO_ERROR)
	{
		std::ostringstream msgStr;
		if (msg)
			msgStr << msg << ": ";

		msgStr << "glGetError() returned " << getErrorStr(err);

		if (err == GL_OUT_OF_MEMORY)
			throw OutOfMemoryError(msgStr.str().c_str(), DE_NULL, file, line);
		else
			throw Error(err, msgStr.str().c_str(), DE_NULL, file, line);
	}
}